

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_trylock.c
# Opt level: O0

int mtx_trylock(mtx_t *mtx)

{
  int iVar1;
  mtx_t *mtx_local;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mtx);
  if (iVar1 == 0) {
    mtx_local._4_4_ = 1;
  }
  else if (iVar1 == 0x10) {
    mtx_local._4_4_ = 2;
  }
  else {
    mtx_local._4_4_ = 3;
  }
  return mtx_local._4_4_;
}

Assistant:

int mtx_trylock( mtx_t * mtx )
{
    switch ( pthread_mutex_trylock( mtx ) )
    {
        case 0:
            return thrd_success;

        case EBUSY:
            return thrd_busy;

        default:
            return thrd_error;
    }
}